

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_normal *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  fmt fVar4;
  undefined8 uVar5;
  long lVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  string *psVar9;
  size_type sVar10;
  ulong uVar11;
  fmt fVar12;
  bool bVar13;
  undefined1 uVar14;
  int iVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  const_iterator cVar18;
  long *plVar19;
  long *plVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  Property *args;
  size_type __n;
  size_type __n_00;
  size_t __n_01;
  _Rb_tree_node_base *__k;
  string *__v;
  char *pcVar24;
  Property *args_2;
  string attr_type_name;
  ostringstream ss_e_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  stringstream ss;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa28;
  undefined1 local_5d0 [8];
  _Alloc_hider local_5c8;
  undefined1 local_5c0 [24];
  undefined1 local_5a8 [16];
  undefined1 local_598 [24];
  string local_580;
  Property *local_560;
  string *local_558;
  key_type local_550;
  UsdPrimvarReader_normal *local_530;
  AttrMetas *local_528;
  AttrMetas *local_520;
  Property *local_518;
  string *local_510;
  _Rb_tree_node_base *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string *local_4e0;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *local_4d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4d0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4c8;
  _Rb_tree_node_base *local_4c0;
  long *local_4b8;
  ulong local_4b0;
  long local_4a8 [2];
  undefined1 local_498 [8];
  undefined1 local_490 [16];
  undefined8 auStack_480 [11];
  ios_base local_428 [264];
  undefined1 local_320 [48];
  string local_2f0 [16];
  undefined1 local_2e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined4 uStack_290;
  undefined1 uStack_28c;
  undefined3 uStack_28b;
  _Alloc_hider _Stack_288;
  undefined1 local_280 [24];
  storage_union sStack_268;
  undefined1 local_258 [32];
  pointer local_238;
  _Rb_tree_node_base _Stack_230;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  pointer local_200;
  pointer pSStack_1f8;
  undefined1 local_1f0 [48];
  _Alloc_hider local_1c0;
  undefined1 auStack_1b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  storage_t<double> sStack_180;
  size_type local_178;
  storage_t<tinyusdz::Token> sStack_170;
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  storage_t<tinyusdz::Token> sStack_120;
  pointer local_100;
  undefined1 auStack_f8 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  undefined1 local_a0 [32];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [16];
  storage_t<tinyusdz::Token> local_70;
  storage_t<tinyusdz::Token> sStack_50;
  
  local_320._24_8_ = (long)local_320 + 8;
  local_320._8_4_ = 0;
  local_320._16_8_ = (_Link_type)0x0;
  local_320._40_8_ = 0;
  args_2 = (Property *)err;
  local_510 = warn;
  local_320._32_8_ = local_320._24_8_;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_320,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                             CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                      local_2a0._M_allocated_capacity._0_2_)) + 1);
  }
  p_Var22 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4c0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar13 = true;
  if (p_Var22 != local_4c0) {
    local_528 = &(preader->fallback)._metas;
    local_4c8 = &(preader->fallback)._paths;
    local_4d8 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                &(preader->fallback)._attrib;
    local_518 = (Property *)&preader->varname;
    local_520 = &(preader->result)._metas;
    local_4e0 = (string *)&(preader->result)._actual_type_name;
    local_4d0 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_558 = err;
    local_530 = preader;
    do {
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_500,*(long *)(p_Var22 + 1),
                 (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
      local_560 = (Property *)(p_Var22 + 2);
      local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"inputs:fallback","");
      sVar10 = local_500._M_string_length;
      sVar8 = local_580._M_string_length;
      local_5c8._M_p = local_5c0 + 8;
      local_5c0._0_8_ = (char *)0x0;
      local_5c0._8_8_ = local_5c0._8_8_ & 0xffffffffffffff00;
      __n = local_500._M_string_length;
      if (local_580._M_string_length < local_500._M_string_length) {
        __n = local_580._M_string_length;
      }
      if (__n == 0) {
        if (local_500._M_string_length == local_580._M_string_length) goto LAB_00235009;
LAB_0023519b:
        local_5d0._0_4_ = 1;
      }
      else {
        iVar15 = bcmp(local_500._M_dataplus._M_p,local_580._M_dataplus._M_p,__n);
        if ((sVar10 != sVar8) || (iVar15 != 0)) goto LAB_0023519b;
LAB_00235009:
        pcVar24 = local_490 + 8;
        if (((ulong)p_Var22[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5d0._0_4_ = 7;
          local_5a8._0_8_ = &DAT_0000003e;
          local_498 = (undefined1  [8])pcVar24;
          local_498 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_498,(ulong)local_5a8);
          local_490._8_4_ = (undefined4)local_5a8._0_8_;
          local_490._12_2_ = SUB82(local_5a8._0_8_,4);
          local_490[0xe] = SUB81(local_5a8._0_8_,6);
          local_490[0xf] = SUB81(local_5a8._0_8_,7);
          builtin_strncpy((char *)local_498,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          local_490._0_6_ = (undefined6)local_5a8._0_8_;
          local_490._6_2_ = SUB82(local_5a8._0_8_,6);
          *(char *)((long)local_498 + local_5a8._0_8_) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_498,&local_580,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_5a8._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_5c8,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                     CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                              local_2a0._M_allocated_capacity._0_2_)) + 1);
          }
          if (local_498 != (undefined1  [8])pcVar24) {
            operator_delete((void *)local_498,
                            CONCAT17(local_490[0xf],
                                     CONCAT16(local_490[0xe],
                                              CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
          }
        }
        if (p_Var22[6]._M_left != p_Var22[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4c8,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var22[6]._M_parent);
          local_5d0 = (undefined1  [8])((ulong)local_5d0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_5a8,&local_560->_attrib);
        local_2b0._0_8_ = &local_2a0;
        local_2a0._M_allocated_capacity._0_2_ = 0x6f6e;
        local_2a0._M_allocated_capacity._2_4_ = 0x6c616d72;
        local_2a0._M_allocated_capacity._6_2_ = 0x6633;
        local_2b0._8_4_ = 8;
        local_2b0._12_2_ = 0;
        local_2b0[0xe] = '\0';
        local_2b0[0xf] = '\0';
        local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
        if ((pointer)local_5a8._8_8_ == (pointer)0x8) {
          if (*(long *)local_5a8._0_8_ != 0x66336c616d726f6e) goto LAB_00235205;
LAB_0023555c:
          iVar15 = *(int *)((long)&p_Var22[0x17]._M_parent + 4);
          if (iVar15 == 1) {
            if (p_Var22[5]._M_left == p_Var22[5]._M_parent) {
              if (p_Var22[4]._M_right == (_Base_ptr)0x0) {
                bVar13 = false;
              }
              else {
                iVar15 = (**(code **)p_Var22[4]._M_right)();
                bVar13 = iVar15 == 4;
              }
              uVar14 = (undefined1)p_Var22[5]._M_color;
              if ((bVar13) || ((uVar14 & _S_black) != _S_red)) {
                (local_530->fallback)._blocked = true;
              }
            }
            else {
              uVar14 = (undefined1)p_Var22[5]._M_color;
            }
            if (((((uVar14 & _S_black) == _S_red) && (p_Var22[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar15 = (**(code **)p_Var22[4]._M_right)(), iVar15 == 0 ||
                 ((p_Var22[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar15 = (**(code **)p_Var22[4]._M_right)(), iVar15 == 1)))))) &&
               (p_Var22[5]._M_left == p_Var22[5]._M_parent)) {
              if (p_Var22[6]._M_left != p_Var22[6]._M_parent) {
                AttrMetas::operator=(local_528,(AttrMetas *)(p_Var22 + 7));
                __v = (string *)&local_500;
                goto LAB_00236649;
              }
            }
            else {
              anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                        ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)local_498,
                         (PrimVar *)&p_Var22[4]._M_parent);
              fVar12 = local_498[0];
              local_2b0[0] = local_498[0];
              if (local_498[0] == (fmt)0x1) {
                local_2a0._M_allocated_capacity._0_2_ = (undefined2)local_490._8_4_;
                local_2a0._M_allocated_capacity._2_4_ =
                     (undefined4)
                     (CONCAT26(local_490._12_2_,CONCAT42(local_490._8_4_,local_490._6_2_)) >> 0x20);
                local_2b0._8_4_ = (undefined4)local_490._0_6_;
                local_2b0._12_2_ = SUB62(local_490._0_6_,4);
                local_2b0._14_2_ = local_490._6_2_;
                local_2a0._8_8_ = auStack_480[0];
                _uStack_290 = auStack_480[1];
                _Stack_288._M_p = (pointer)auStack_480[2];
                local_280[0] = (undefined1)auStack_480[3];
                nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
                operator=(local_4d8,(Animatable<tinyusdz::value::normal3f> *)(local_2b0 + 8));
                fVar4 = local_2b0[0];
              }
              else {
                local_5d0._0_4_ = 8;
                warn = (string *)0x55;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_5c8,0,(char *)local_5c0._0_8_,0x3a2fb6);
                fVar4 = fVar12;
              }
              if ((((byte)fVar4 & 1) != 0) && ((void *)local_2a0._8_8_ != (void *)0x0)) {
                operator_delete((void *)local_2a0._8_8_,(long)_Stack_288._M_p - local_2a0._8_8_);
              }
              if (fVar12 != (fmt)0x0) goto LAB_0023662d;
            }
          }
          else if (iVar15 == 0) {
            (local_530->fallback)._value_empty = true;
LAB_0023662d:
            AttrMetas::operator=(local_528,(AttrMetas *)(p_Var22 + 7));
            __v = &local_580;
LAB_00236649:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            local_5d0 = (undefined1  [8])((ulong)local_5d0 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace((ulong)&local_5c8,0,(char *)local_5c0._0_8_,0x3a2ce8)
            ;
            local_5d0._0_4_ = 8;
          }
        }
        else {
          local_490._12_2_ = 0x3374;
          local_490._8_4_ = 0x616f6c66;
          local_490[0] = '\x06';
          local_490[1] = '\0';
          local_490[2] = '\0';
          local_490[3] = '\0';
          local_490[4] = '\0';
          local_490[5] = '\0';
          local_490[6] = '\0';
          local_490[7] = '\0';
          local_490[0xe] = '\0';
          local_498 = (undefined1  [8])pcVar24;
          if (((pointer)local_5a8._8_8_ == (pointer)0x6) &&
             ((short)*(int *)(local_5a8._0_8_ + 4) == 0x3374 &&
              *(int *)local_5a8._0_8_ == 0x616f6c66)) goto LAB_0023555c;
LAB_00235205:
          local_5d0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,local_580._M_dataplus._M_p,
                               local_580._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," expects type `",0xf);
          local_490._8_4_ = 0x6d726f6e;
          local_490._12_2_ = 0x6c61;
          local_490[0xe] = '3';
          local_490[0xf] = 'f';
          local_490[0] = '\b';
          local_490[1] = '\0';
          local_490[2] = '\0';
          local_490[3] = '\0';
          local_490[4] = '\0';
          local_490[5] = '\0';
          local_490[6] = '\0';
          local_490[7] = '\0';
          auStack_480[0] = auStack_480[0] & 0xffffffffffffff00;
          local_498 = (undefined1  [8])pcVar24;
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar24,8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"` but defined as type `",0x17);
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(char *)local_5a8._0_8_,local_5a8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"`",1);
          if (local_498 != (undefined1  [8])pcVar24) {
            operator_delete((void *)local_498,
                            CONCAT17(local_490[0xf],
                                     CONCAT16(local_490[0xe],
                                              CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_5c8,(string *)local_498);
          if (local_498 != (undefined1  [8])pcVar24) {
            operator_delete((void *)local_498,
                            CONCAT17(local_490[0xf],
                                     CONCAT16(local_490[0xe],
                                              CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)&_Stack_230);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598) {
          operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
        }
      }
      pcVar24 = local_490 + 8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
      }
      iVar15 = 0;
      if (((ulong)local_5d0 & 0xfffffffd) == 0) {
        iVar15 = 3;
LAB_00235618:
        bVar13 = false;
      }
      else {
        bVar13 = true;
        if (local_5d0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x119a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          local_5a8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5a8,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_498,(fmt *)local_5a8,(string *)"inputs:fallback",
                     (char (*) [16])&local_5c8,warn);
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_498,
                               CONCAT26(local_490._6_2_,local_490._0_6_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          if (local_498 != (undefined1  [8])pcVar24) {
            operator_delete((void *)local_498,
                            CONCAT17(local_490[0xf],
                                     CONCAT16(local_490[0xe],
                                              CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
          }
          psVar9 = local_558;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598) {
            operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
          }
          if (psVar9 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_5a8,(ulong)(psVar9->_M_dataplus)._M_p)
            ;
            pcVar1 = (char *)(puVar17 + 2);
            if ((char *)*puVar17 == pcVar1) {
              uVar5 = *(undefined8 *)pcVar1;
              auStack_480[0] = puVar17[3];
              local_490._8_4_ = (undefined4)uVar5;
              local_490._12_2_ = (undefined2)((ulong)uVar5 >> 0x20);
              local_490[0xe] = (undefined1)((ulong)uVar5 >> 0x30);
              local_490[0xf] = (undefined1)((ulong)uVar5 >> 0x38);
              local_498 = (undefined1  [8])pcVar24;
            }
            else {
              uVar5 = *(undefined8 *)pcVar1;
              local_490._8_4_ = (undefined4)uVar5;
              local_490._12_2_ = (undefined2)((ulong)uVar5 >> 0x20);
              local_490[0xe] = (undefined1)((ulong)uVar5 >> 0x30);
              local_490[0xf] = (undefined1)((ulong)uVar5 >> 0x38);
              local_498 = (undefined1  [8])*puVar17;
            }
            local_490._0_6_ = (undefined6)puVar17[1];
            local_490._6_2_ = (undefined2)((ulong)puVar17[1] >> 0x30);
            *puVar17 = pcVar1;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar9,(string *)local_498);
            if (local_498 != (undefined1  [8])pcVar24) {
              operator_delete((void *)local_498,
                              CONCAT17(local_490[0xf],
                                       CONCAT16(local_490[0xe],
                                                CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598) {
              operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          iVar15 = 1;
          goto LAB_00235618;
        }
      }
      if (local_5c8._M_p != local_5c0 + 8) {
        operator_delete(local_5c8._M_p,local_5c0._8_8_ + 1);
      }
      if (bVar13) {
        local_508 = p_Var22 + 1;
        iVar15 = ::std::__cxx11::string::compare((char *)local_508);
        if (iVar15 == 0) {
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_320,(key_type *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                     CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                              local_2a0._M_allocated_capacity._0_2_)) + 1);
          }
          if (cVar18._M_node == (_Base_ptr)(local_320 + 8)) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
            local_2b0._12_2_ = 0;
            local_2b0[0xe] = '\0';
            local_2b0[0xf] = '\0';
            local_2a0._M_allocated_capacity._0_2_ = 0;
            local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
            _Stack_230._M_left = (_Base_ptr)0x0;
            _Stack_230._M_right._0_1_ = 0;
            local_100 = (pointer)0x0;
            auStack_f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_120._16_8_ = 0;
            sStack_120._24_8_ = 0;
            auStack_f8._16_4_ = 0;
            auStack_f8._24_8_ = 0;
            sStack_268._8_1_ = 0;
            local_280._16_8_ = 0;
            sStack_268.dynamic = (void *)0x0;
            local_280._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_280._8_8_ = 0;
            uStack_290 = Varying;
            uStack_28c = false;
            uStack_28b = 0;
            _Stack_288._M_p = (pointer)0x0;
            _Stack_230._M_parent._0_1_ = 0;
            local_238 = (pointer)0x0;
            _Stack_230._M_color = _S_red;
            _Stack_230._4_4_ = 0;
            local_258._16_8_ = (pointer)0x0;
            local_258._24_8_ = (pointer)0x0;
            local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_258._8_8_ = 0;
            local_1f0[0] = 0;
            local_200 = (pointer)0x0;
            pSStack_1f8 = (pointer)0x0;
            local_210.has_value_ = false;
            local_210._1_3_ = 0;
            local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
            oStack_208.has_value_ = false;
            oStack_208._1_3_ = 0;
            oStack_208.contained = (storage_t<unsigned_int>)0x0;
            local_1f0[0x28] = '\0';
            local_1f0._24_8_ = 0;
            local_1f0._32_8_ = 0;
            local_1f0._8_8_ = 0;
            local_1f0._16_8_ = 0;
            auStack_1b8[0x18] = 0;
            auStack_1b8._8_8_ = 0;
            auStack_1b8._16_8_ = 0;
            local_1c0._M_p = (pointer)0x0;
            auStack_1b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_170._8_1_ = 0;
            local_178 = 0;
            sStack_170.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            aStack_190._8_8_ = 0;
            sStack_180 = (storage_t<double>)0x0;
            auStack_1b8._32_8_ = 0;
            aStack_190._M_allocated_capacity = 0;
            local_150[0x10] = 0;
            local_150._0_8_ = 0;
            local_150._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_170._16_8_ = 0;
            sStack_170._24_8_ = 0;
            sStack_120._8_1_ = 0;
            aStack_130._8_8_ = 0;
            sStack_120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_150._24_8_ = 0;
            aStack_130._M_allocated_capacity = 0;
            auStack_f8._32_8_ = (long)auStack_f8 + 0x10;
            sStack_c0._24_1_ = 0;
            sStack_c0._8_8_ = 0;
            sStack_c0._16_8_ = 0;
            auStack_f8._48_8_ = 0;
            sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_a0[0x10] = 0;
            local_a0._17_8_ = 0;
            local_a0._0_8_ = (pointer)0x0;
            local_a0[8] = 0;
            local_a0._9_7_ = 0;
            sStack_50._16_1_ = 0;
            sStack_50._17_8_ = 0;
            sStack_50.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            sStack_50._8_1_ = _S_red;
            sStack_50._9_7_ = 0;
            local_70._16_8_ = 0;
            local_70._24_8_ = 0;
            local_70.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_70._8_8_ = 0;
            local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[8] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[9] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[10] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xb] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xc] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xd] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xe] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_80[0xf] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
            local_2e0._16_8_ = &local_2c0;
            auStack_f8._40_8_ = auStack_f8._32_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_2e0 + 0x10),*(long *)(p_Var22 + 1),
                       (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
            warn = (string *)local_498;
            local_498 = (undefined1  [8])pcVar24;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            args_2 = (Property *)local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5d0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_320,(string *)(local_2e0 + 0x10),local_560,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            if (local_498 != (undefined1  [8])pcVar24) {
              operator_delete((void *)local_498,
                              CONCAT17(local_490[0xf],
                                       CONCAT16(local_490[0xe],
                                                CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._16_8_ != &local_2c0) {
              operator_delete((void *)local_2e0._16_8_,local_2c0._M_allocated_capacity + 1);
            }
            if (local_5d0._0_4_ == TypeMismatch) {
              local_2f0._0_8_ = local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var22 + 1),
                         (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
              warn = (string *)local_498;
              local_498 = (undefined1  [8])pcVar24;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
              args = local_560;
              args_2 = local_518;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_5a8,(_anonymous_namespace_ *)local_320,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_560,(Property *)warn,(string *)local_518,
                         in_stack_fffffffffffffa28);
              if (local_498 != (undefined1  [8])pcVar24) {
                operator_delete((void *)local_498,
                                CONCAT17(local_490[0xf],
                                         CONCAT16(local_490[0xe],
                                                  CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
              }
              paVar3 = &local_580.field_2;
              if ((undefined1 *)local_2f0._0_8_ != local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0._0_8_ + 1);
              }
              if (local_5a8._0_4_ == Success) {
                iVar15 = 3;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_498,0x11b3);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_550,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          (&local_580,(fmt *)&local_550,(string *)(local_5a8 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_498,local_580._M_dataplus._M_p,
                                     local_580._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_580._M_dataplus._M_p != paVar3) {
                  operator_delete(local_580._M_dataplus._M_p,
                                  local_580.field_2._M_allocated_capacity + 1);
                }
                psVar9 = local_558;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_550._M_dataplus._M_p != &local_550.field_2) {
                  operator_delete(local_550._M_dataplus._M_p,
                                  local_550.field_2._M_allocated_capacity + 1);
                }
                if (psVar9 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar20 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_550,(ulong)(psVar9->_M_dataplus)._M_p)
                  ;
                  psVar2 = (size_type *)(plVar20 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar20 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar2) {
                    local_580.field_2._M_allocated_capacity = *psVar2;
                    local_580.field_2._8_8_ = plVar20[3];
                    local_580._M_dataplus._M_p = (pointer)paVar3;
                  }
                  else {
                    local_580.field_2._M_allocated_capacity = *psVar2;
                    local_580._M_dataplus._M_p = (pointer)*plVar20;
                  }
                  local_580._M_string_length = plVar20[1];
                  *plVar20 = (long)psVar2;
                  plVar20[1] = 0;
                  *(undefined1 *)(plVar20 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_580);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_580._M_dataplus._M_p != paVar3) {
                    operator_delete(local_580._M_dataplus._M_p,
                                    local_580.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_550._M_dataplus._M_p != &local_550.field_2) {
                    operator_delete(local_550._M_dataplus._M_p,
                                    local_550.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
                ::std::ios_base::~ios_base(local_428);
                iVar15 = 1;
              }
              if ((undefined1 *)local_5a8._8_8_ != local_598 + 8) {
                operator_delete((void *)local_5a8._8_8_,local_598._8_8_ + 1);
              }
            }
            else {
              iVar15 = 0;
              if (local_5d0._0_4_ == Success) {
                bVar13 = ConvertTokenAttributeToStringAttribute
                                   ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                    local_2b0,
                                    (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_518);
                iVar15 = 3;
                if (!bVar13) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"():",3)
                  ;
                  poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_498,0x11a1)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_498,
                             "Failed to convert inputs:varname token type to string type.",0x3b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
                  psVar9 = local_558;
                  if (local_558 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar20 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_580,
                                                 (ulong)(psVar9->_M_dataplus)._M_p);
                    pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (plVar20 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar20 == pbVar23) {
                      local_598._0_8_ = (pbVar23->_M_dataplus)._M_p;
                      local_598._8_8_ = plVar20[3];
                      local_5a8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_598;
                    }
                    else {
                      local_598._0_8_ = (pbVar23->_M_dataplus)._M_p;
                      local_5a8._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar20;
                    }
                    local_5a8._8_8_ = plVar20[1];
                    *plVar20 = (long)pbVar23;
                    plVar20[1] = 0;
                    *(undefined1 *)(plVar20 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar9,(string *)local_5a8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a8._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_598) {
                      operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_580._M_dataplus._M_p != &local_580.field_2) {
                      operator_delete(local_580._M_dataplus._M_p,
                                      local_580.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
                  ::std::ios_base::~ios_base(local_428);
                  iVar15 = 1;
                }
              }
            }
            if (local_5c8._M_p != local_5c0 + 8) {
              operator_delete(local_5c8._M_p,local_5c0._8_8_ + 1);
            }
            if (local_a0[0x18] == '\x01') {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value(local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            if (iVar15 != 0) goto LAB_00236876;
          }
        }
        local_4b8 = local_4a8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4b8,*(long *)(p_Var22 + 1),
                   (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"outputs:result","");
        uVar11 = local_4b0;
        sVar10 = local_550._M_string_length;
        local_490._0_6_ = SUB86(auStack_480,0);
        local_490._6_2_ = (undefined2)((ulong)auStack_480 >> 0x30);
        local_490._8_4_ = 0;
        local_490._12_2_ = 0;
        local_490[0xe] = '\0';
        local_490[0xf] = '\0';
        auStack_480[0] = auStack_480[0] & 0xffffffffffffff00;
        __n_00 = local_4b0;
        if (local_550._M_string_length < local_4b0) {
          __n_00 = local_550._M_string_length;
        }
        if (__n_00 == 0) {
          if (local_4b0 == local_550._M_string_length) goto LAB_00235770;
LAB_002357a8:
          local_498._0_4_ = 1;
        }
        else {
          iVar15 = bcmp(local_4b8,local_550._M_dataplus._M_p,__n_00);
          if ((uVar11 != sVar10) || (iVar15 != 0)) goto LAB_002357a8;
LAB_00235770:
          cVar18 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_320,&local_550);
          if (cVar18._M_node == (_Base_ptr)(local_320 + 8)) {
            if (*(uint *)((long)&p_Var22[0x17]._M_parent + 4) < 2) {
              bVar13 = Attribute::is_connection(&local_560->_attrib);
              if (bVar13) {
                local_498._0_4_ = 5;
                warn = (string *)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)local_490,0,
                           (char *)CONCAT17(local_490[0xf],
                                            CONCAT16(local_490[0xe],
                                                     CONCAT24(local_490._12_2_,local_490._8_4_))),
                           0x3a4f85);
              }
              else {
                if (*(int *)((long)&p_Var22[0x17]._M_parent + 4) != 0) goto LAB_002363a2;
                Attribute::type_name_abi_cxx11_((string *)local_2b0,&local_560->_attrib);
                bVar13 = tinyusdz::value::IsRoleType((string *)local_2b0);
                local_5d0 = (undefined1  [8])local_5c0;
                local_5c0._0_8_ = (char *)0x66336c616d726f6e;
                local_5c8._M_p = (pointer)0x8;
                local_5c0._8_8_ = local_5c0._8_8_ & 0xffffffffffffff00;
                lVar6 = CONCAT26(local_2b0._14_2_,CONCAT24(local_2b0._12_2_,local_2b0._8_4_));
                if (lVar6 == 8) {
                  if (*(size_type *)local_2b0._0_8_ == 0x66336c616d726f6e) {
                    (local_530->result)._authored = true;
                    goto LAB_00236a07;
                  }
                  if (bVar13) goto LAB_00236663;
LAB_002368ea:
                  local_498._0_4_ = 3;
                  local_580._M_dataplus._M_p = (pointer)0x61;
                  local_5a8._0_8_ = local_598;
                  pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create((ulong *)local_5a8,(ulong)&local_580);
                  __n_01 = 0x61;
                  pcVar24 = 
                  "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                  ;
LAB_0023693b:
                  _Var7._M_p = local_580._M_dataplus._M_p;
                  local_5a8._0_8_ = pbVar23;
                  local_598._0_8_ = local_580._M_dataplus._M_p;
                  memcpy(pbVar23,pcVar24,__n_01);
                  local_5a8._8_8_ = _Var7._M_p;
                  *((long)&(pbVar23->_M_dataplus)._M_p + _Var7._M_p) = '\0';
                  local_580.field_2._M_allocated_capacity = 0x66336c616d726f6e;
                  local_580._M_string_length = 8;
                  local_580.field_2._8_8_ = local_580.field_2._8_8_ & 0xffffffffffffff00;
                  warn = (string *)local_2b0;
                  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_5d0,(fmt *)local_5a8,&local_550,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_580,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args_2);
                  ::std::__cxx11::string::operator=((string *)local_490,(string *)local_5d0);
                  if (local_5d0 != (undefined1  [8])local_5c0) {
                    operator_delete((void *)local_5d0,(ulong)(local_5c0._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_580._M_dataplus._M_p != &local_580.field_2) {
                    operator_delete(local_580._M_dataplus._M_p,
                                    local_580.field_2._M_allocated_capacity + 1);
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_5a8._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598
                     ) {
                    operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
                  }
                }
                else {
                  if (bVar13) {
LAB_00236663:
                    local_498._0_4_ = 3;
                    local_580._M_dataplus._M_p = (pointer)0x47;
                    local_5a8._0_8_ = local_598;
                    pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ::std::__cxx11::string::_M_create
                                        ((ulong *)local_5a8,(ulong)&local_580);
                    __n_01 = 0x47;
                    pcVar24 = 
                    "Attribute type mismatch. {} expects type `{}` but defined as type `{}`.";
                    goto LAB_0023693b;
                  }
                  local_5c8._M_p = (pointer)0x6;
                  local_5c0._0_8_ = (char *)0x66003374616f6c66;
                  if ((lVar6 != 6) ||
                     ((short)*(int *)(local_2b0._0_8_ + 4) != 0x3374 ||
                      *(int *)local_2b0._0_8_ != 0x616f6c66)) goto LAB_002368ea;
                  (local_530->result)._authored = true;
                  ::std::__cxx11::string::_M_assign(local_4e0);
LAB_00236a07:
                  AttrMetas::operator=(local_520,(AttrMetas *)(p_Var22 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_320,&local_550);
                  local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._0_8_ != &local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,
                                  CONCAT26(local_2a0._M_allocated_capacity._6_2_,
                                           CONCAT42(local_2a0._M_allocated_capacity._2_4_,
                                                    local_2a0._M_allocated_capacity._0_2_)) + 1);
                }
              }
            }
            else {
LAB_002363a2:
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)local_490,0,
                         (char *)CONCAT17(local_490[0xf],
                                          CONCAT16(local_490[0xe],
                                                   CONCAT24(local_490._12_2_,local_490._8_4_))),
                         0x3a4fbe);
              local_498._0_4_ = 6;
            }
          }
          else {
            local_498._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if (local_4b8 != local_4a8) {
          operator_delete(local_4b8,local_4a8[0] + 1);
        }
        iVar15 = 0;
        if (((ulong)local_498 & 0xfffffffd) == 0) {
          iVar15 = 3;
LAB_00235e2c:
          bVar13 = false;
        }
        else {
          bVar13 = true;
          if (local_498._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x11b9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            local_5a8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5d0,(fmt *)local_5a8,(string *)"outputs:result",
                       (char (*) [15])local_490,warn);
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5d0,(long)local_5c8._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
            if (local_5d0 != (undefined1  [8])local_5c0) {
              operator_delete((void *)local_5d0,(ulong)(local_5c0._0_8_ + 1));
            }
            psVar9 = local_558;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598) {
              operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
            }
            if (psVar9 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar19 = (long *)::std::__cxx11::string::_M_append
                                          (local_5a8,(ulong)(psVar9->_M_dataplus)._M_p);
              plVar20 = plVar19 + 2;
              if ((long *)*plVar19 == plVar20) {
                local_5c0._0_8_ = *plVar20;
                local_5c0._8_8_ = plVar19[3];
                local_5d0 = (undefined1  [8])local_5c0;
              }
              else {
                local_5c0._0_8_ = *plVar20;
                local_5d0 = (undefined1  [8])*plVar19;
              }
              local_5c8._M_p = (pointer)plVar19[1];
              *plVar19 = (long)plVar20;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)local_5d0);
              if (local_5d0 != (undefined1  [8])local_5c0) {
                operator_delete((void *)local_5d0,(ulong)(local_5c0._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_5a8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598) {
                operator_delete((void *)local_5a8._0_8_,(ulong)(local_598._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
            iVar15 = 1;
            goto LAB_00235e2c;
          }
        }
        if ((undefined8 *)CONCAT26(local_490._6_2_,local_490._0_6_) != auStack_480) {
          operator_delete((undefined8 *)CONCAT26(local_490._6_2_,local_490._0_6_),auStack_480[0] + 1
                         );
        }
        __k = local_508;
        if (!bVar13) goto LAB_00236876;
        cVar18 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_320,(key_type *)local_508);
        if (cVar18._M_node == (_Base_ptr)(local_320 + 8)) {
          pmVar21 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_4d0,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar21);
          (pmVar21->_attrib)._varying_authored = (bool)p_Var22[3].field_0x4;
          (pmVar21->_attrib)._variability = p_Var22[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar21->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar21->_attrib)._var,(any *)&p_Var22[4]._M_parent);
          (pmVar21->_attrib)._var._blocked = SUB41(p_Var22[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar21->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var22[5]._M_parent);
          (pmVar21->_attrib)._var._ts._dirty = SUB41(p_Var22[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar21->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var22[6]._M_parent);
          AttrMetas::operator=(&(pmVar21->_attrib)._metas,(AttrMetas *)(p_Var22 + 7));
          *(_Base_ptr *)&pmVar21->_listOpQual = p_Var22[0x17]._M_parent;
          (pmVar21->_rel).type = *(Type *)&p_Var22[0x17]._M_left;
          Path::operator=(&(pmVar21->_rel).targetPath,(Path *)&p_Var22[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar21->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var22[0x1e]._M_parent);
          (pmVar21->_rel).listOpQual = p_Var22[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar21->_rel)._metas,(AttrMetas *)&p_Var22[0x1f]._M_parent);
          (pmVar21->_rel)._varying_authored = *(bool *)&p_Var22[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar21->_prop_value_type_name);
          __k = local_508;
          pmVar21->_has_custom = *(bool *)&p_Var22[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_320,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508)
          ;
        }
        cVar18 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_320,(key_type *)__k);
        pcVar24 = local_490 + 8;
        if (cVar18._M_node == (_Base_ptr)(local_320 + 8)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x11bb);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_498,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_498,
                               CONCAT26(local_490._6_2_,local_490._0_6_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          if (local_498 != (undefined1  [8])pcVar24) {
            operator_delete((void *)local_498,
                            CONCAT17(local_490[0xf],
                                     CONCAT16(local_490[0xe],
                                              CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
          }
          psVar9 = local_558;
          if (local_510 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar17 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_5d0,(ulong)(psVar9->_M_dataplus)._M_p)
            ;
            pcVar1 = (char *)(puVar17 + 2);
            if ((char *)*puVar17 == pcVar1) {
              uVar5 = *(undefined8 *)pcVar1;
              auStack_480[0] = puVar17[3];
              local_490._8_4_ = (undefined4)uVar5;
              local_490._12_2_ = (undefined2)((ulong)uVar5 >> 0x20);
              local_490[0xe] = (undefined1)((ulong)uVar5 >> 0x30);
              local_490[0xf] = (undefined1)((ulong)uVar5 >> 0x38);
              local_498 = (undefined1  [8])pcVar24;
            }
            else {
              uVar5 = *(undefined8 *)pcVar1;
              local_490._8_4_ = (undefined4)uVar5;
              local_490._12_2_ = (undefined2)((ulong)uVar5 >> 0x20);
              local_490[0xe] = (undefined1)((ulong)uVar5 >> 0x30);
              local_490[0xf] = (undefined1)((ulong)uVar5 >> 0x38);
              local_498 = (undefined1  [8])*puVar17;
            }
            local_490._0_6_ = (undefined6)puVar17[1];
            local_490._6_2_ = (undefined2)((ulong)puVar17[1] >> 0x30);
            *puVar17 = pcVar1;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_510,(string *)local_498);
            if (local_498 != (undefined1  [8])pcVar24) {
              operator_delete((void *)local_498,
                              CONCAT17(local_490[0xf],
                                       CONCAT16(local_490[0xe],
                                                CONCAT24(local_490._12_2_,local_490._8_4_))) + 1);
            }
            if (local_5d0 != (undefined1  [8])local_5c0) {
              operator_delete((void *)local_5d0,(ulong)(local_5c0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
        }
      }
      else {
LAB_00236876:
        if ((iVar15 != 3) && (iVar15 != 0)) {
          bVar13 = false;
          goto LAB_00236a8b;
        }
      }
      p_Var22 = (_Base_ptr)::std::_Rb_tree_increment(p_Var22);
    } while (p_Var22 != local_4c0);
    bVar13 = true;
  }
LAB_00236a8b:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_320,(_Link_type)local_320._16_8_);
  return bVar13;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_normal>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_normal *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_normal,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_normal, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_normal, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}